

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int analyze_miniscript(char *miniscript,char **key_name_array,char **key_value_array,
                      size_t array_len,uint32_t target,uint32_t *network,uint32_t flags,
                      miniscript_node_t *prev_node,miniscript_node_t *parent_node,
                      miniscript_node_t **generate_node,char **script_ignore_checksum)

{
  char cVar1;
  miniscript_item_t *pmVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  miniscript_node_t *parent_node_00;
  longlong lVar8;
  uchar *bytes_out;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  uint32_t result;
  uint uVar12;
  uint32_t *astarisk_index;
  size_t sVar13;
  long lVar14;
  uint32_t uVar15;
  size_t sVar16;
  size_t __n;
  address_script_t *local_2b0;
  size_t buf_len_1;
  char *sub_str;
  uint *local_278;
  size_t local_270;
  miniscript_node_t *child;
  size_t sub_str_len;
  int local_254;
  char **local_250;
  miniscript_node_t *local_248;
  char **local_240;
  char *local_238;
  char *local_230;
  char work_checksum [12];
  char checksum [12];
  size_t buf_len;
  uchar privkey_bytes [38];
  uchar pubkey [65];
  char buffer [64];
  ext_key extkey;
  uchar local_88 [88];
  
  sub_str = (char *)0x0;
  sub_str_len = 0;
  child = (miniscript_node_t *)0x0;
  astarisk_index = network;
  local_270 = array_len;
  local_240 = key_name_array;
  sVar7 = strlen(miniscript);
  parent_node_00 = (miniscript_node_t *)wally_malloc(0x80);
  if (parent_node_00 == (miniscript_node_t *)0x0) {
    return -3;
  }
  local_250 = key_value_array;
  wally_bzero(parent_node_00,0x80);
  wally_bzero(buffer,0x40);
  wally_bzero(checksum,0xc);
  wally_bzero(work_checksum,0xc);
  if (parent_node != (miniscript_node_t *)0x0) {
    parent_node_00->parent = parent_node;
  }
  if (sVar7 == 0) {
LAB_0049a5a0:
    local_238 = (char *)0x0;
    if (parent_node == (miniscript_node_t *)0x0) {
      if (miniscript != (char *)0x0) {
        bVar3 = true;
        goto LAB_0049a5db;
      }
LAB_0049a619:
      iVar6 = -2;
    }
    else {
      iVar6 = -2;
      if ((miniscript != (char *)0x0) && (parent_node->info != (miniscript_item_t *)0x0)) {
        bVar3 = false;
LAB_0049a5db:
        __n = 0;
LAB_0049a5de:
        local_238 = (char *)0x0;
        iVar6 = -2;
        if (*miniscript != '\0') {
          if (network == (uint *)0x0) {
            local_2b0 = (address_script_t *)0x0;
LAB_0049a637:
            sVar7 = strlen(miniscript);
            if ((!bVar3) && (parent_node->info->kind == 0x40002)) {
              iVar6 = analyze_miniscript_addr
                                (miniscript,parent_node_00,parent_node,local_2b0,(uchar *)0x0,0,
                                 (size_t *)0x0);
              goto LAB_0049abc2;
            }
            if (local_270 != 0) {
              sVar16 = 0;
              do {
                iVar6 = strncmp(miniscript,local_240[sVar16],sVar7 + 1);
                if (iVar6 == 0) {
                  pcVar9 = wally_strdup(local_250[sVar16]);
                  parent_node_00->data = pcVar9;
                  if (pcVar9 == (char *)0x0) goto LAB_0049ad9f;
                  sVar7 = strlen(pcVar9);
                  parent_node_00->data_size = (uint32_t)sVar7;
                  break;
                }
                sVar16 = sVar16 + 1;
              } while (local_270 != sVar16);
            }
            pcVar9 = parent_node_00->data;
            if (pcVar9 == (char *)0x0) {
              pcVar9 = wally_strdup(miniscript);
              parent_node_00->data = pcVar9;
              parent_node_00->data_size = (uint32_t)sVar7;
            }
            if (bVar3) {
LAB_0049a72e:
              lVar8 = strtoll(pcVar9,&local_238,10);
              parent_node_00->number = lVar8;
              if ((local_238 == (char *)0x0) || (*local_238 == '\0')) {
                parent_node_00->kind = 8;
                uVar15 = 0x35101;
                if (lVar8 == 0) {
                  uVar15 = 0x3b901;
                }
                parent_node_00->type_properties = uVar15;
                goto LAB_0049abcb;
              }
              sVar7 = strlen(parent_node_00->data);
              if ((!bVar3) && (parent_node->info == (miniscript_item_t *)0x0)) {
LAB_0049a9c0:
                iVar6 = -2;
                goto LAB_0049abc2;
              }
              wally_bzero(&extkey,0xc0);
              pcVar9 = parent_node_00->data;
              if (*pcVar9 == '[') {
                pcVar10 = strchr(pcVar9,0x5d);
                if (pcVar10 == (char *)0x0) goto LAB_0049a9c0;
                iVar6 = (int)pcVar10 - (int)pcVar9;
                pcVar9 = (char *)wally_malloc((long)(iVar6 + 2));
                parent_node_00->key_origin_info = pcVar9;
                if (pcVar9 == (char *)0x0) {
                  iVar6 = -3;
                  goto LAB_0049abc2;
                }
                uVar15 = iVar6 + 1;
                sVar13 = (size_t)(int)uVar15;
                memcpy(pcVar9,parent_node_00->data,sVar13);
                parent_node_00->key_origin_info[sVar13] = '\0';
                parent_node_00->key_origin_info_len = uVar15;
                sVar7 = sVar7 - sVar13;
                memmove(parent_node_00->data,pcVar10 + 1,sVar7);
                parent_node_00->data[sVar7] = '\0';
              }
              if ((flags & 1) == 0) {
                if (((sVar7 == 0x82) || (sVar7 == 0x42)) &&
                   (iVar6 = wally_hex_to_bytes(parent_node_00->data,pubkey,0x41,&buf_len_1),
                   iVar6 == 0)) {
                  parent_node_00->kind = 0x1020;
                  if (sVar7 == 0x82) {
                    parent_node_00->is_uncompress_key = true;
                  }
LAB_0049aecc:
                  iVar6 = wally_ec_public_key_verify(pubkey,buf_len_1);
                  goto LAB_0049abc2;
                }
              }
              else if ((sVar7 == 0x40) &&
                      (iVar6 = wally_hex_to_bytes(parent_node_00->data,pubkey,0x41,&buf_len_1),
                      iVar6 == 0)) {
                parent_node_00->kind = 0x1020;
                parent_node_00->is_xonly_key = true;
                memmove(pubkey + 1,pubkey,buf_len_1);
                pubkey[0] = '\x02';
                buf_len_1 = buf_len_1 + 1;
                goto LAB_0049aecc;
              }
              iVar6 = wally_base58_to_bytes(parent_node_00->data,1,privkey_bytes,0x26,&buf_len_1);
              if (buf_len_1 < 0x23 && iVar6 == 0) {
                if ((local_2b0 == (address_script_t *)0x0) ||
                   (iVar6 = -2, local_2b0->version_wif == privkey_bytes[0])) {
                  if (buf_len_1 == 0x21) {
                    parent_node_00->kind = 0x2020;
                    parent_node_00->is_uncompress_key = true;
                    iVar6 = -2;
                    if ((flags & 1) == 0) {
LAB_0049ae79:
                      iVar6 = wally_ec_private_key_verify(privkey_bytes + 1,0x20);
                    }
                  }
                  else {
                    iVar6 = -2;
                    if ((buf_len_1 == 0x22) && (privkey_bytes[0x21] == '\x01')) {
                      parent_node_00->kind = 0x2020;
                      if ((flags & 1) != 0) {
                        parent_node_00->is_xonly_key = true;
                      }
                      goto LAB_0049ae79;
                    }
                  }
                }
              }
              else {
                pcVar9 = strchr(parent_node_00->data,0x2f);
                if (pcVar9 == (char *)0x0) {
LAB_0049ab00:
                  iVar6 = wally_base58_to_bytes(parent_node_00->data,1,local_88,0x52,&buf_len_1);
                  if (((iVar6 == 0) && (iVar5 = -2, iVar6 = iVar5, buf_len_1 < 0x53)) &&
                     (iVar6 = bip32_key_unserialize(local_88,buf_len_1,&extkey), iVar6 == 0)) {
                    if (extkey.priv_key[0] == '\0') {
                      parent_node_00->kind = 0x14020;
                      if (extkey.version == 0x488ade4) goto LAB_0049ab8f;
LAB_0049aefd:
                      if ((local_2b0 != (address_script_t *)0x0) &&
                         (iVar6 = iVar5, (local_2b0->network | 2) == 3)) goto LAB_0049abc2;
                    }
                    else {
                      parent_node_00->kind = 0x24020;
                      if (extkey.version != 0x488b21e) goto LAB_0049aefd;
LAB_0049ab8f:
                      if ((local_2b0 != (address_script_t *)0x0) &&
                         (iVar6 = iVar5, (local_2b0->network | 2) != 3)) goto LAB_0049abc2;
                    }
                    if ((flags & 1) != 0) {
                      parent_node_00->is_xonly_key = true;
                    }
                    pcVar9 = parent_node_00->derive_path;
                    iVar6 = 0;
                    if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
                      iVar6 = convert_bip32_path_to_array
                                        (pcVar9,(uint32_t *)0x0,(uint)(extkey.priv_key[0] == '\0'),
                                         false,(uint32_t *)0x0,(int8_t *)astarisk_index);
                    }
                  }
                }
                else {
                  iVar6 = -2;
                  if (pcVar9[1] != '/') {
                    pcVar10 = wally_strdup(pcVar9);
                    parent_node_00->derive_path = pcVar10;
                    if (pcVar10 != (char *)0x0) {
                      sVar7 = strlen(pcVar10);
                      parent_node_00->derive_path_len = (uint32_t)sVar7;
                      *pcVar9 = '\0';
                      pcVar9 = strchr(parent_node_00->derive_path,0x2a);
                      if (pcVar9 != (char *)0x0) {
                        parent_node_00->is_derive = true;
                      }
                      goto LAB_0049ab00;
                    }
                    iVar6 = -3;
                  }
                }
              }
LAB_0049abc2:
              if (iVar6 == 0) goto LAB_0049abcb;
              goto LAB_0049ada5;
            }
            iVar6 = parent_node->info->kind;
            if (iVar6 < 0x50001) {
              if ((iVar6 != 0x30001) && (iVar6 != 0x40001)) goto LAB_0049a72e;
            }
            else if ((1 < iVar6 - 0x50001U) && (iVar6 != 0x60001)) goto LAB_0049a72e;
            bytes_out = (uchar *)wally_strdup(pcVar9);
            if (bytes_out != (uchar *)0x0) {
              iVar6 = wally_hex_to_bytes(parent_node_00->data,bytes_out,sVar7,&buf_len);
              if (iVar6 == 0) {
                parent_node_00->kind = 4;
              }
              wally_free_string((char *)bytes_out);
              goto LAB_0049abc2;
            }
            goto LAB_0049ad9f;
          }
          lVar14 = 0;
          do {
            if (*network == (uint)(&g_network_address_table[0].network)[lVar14]) {
              local_2b0 = (address_script_t *)(&g_network_address_table[0].network + lVar14);
              goto LAB_0049a637;
            }
            lVar14 = lVar14 + 0x10;
          } while (lVar14 != 0x50);
        }
      }
    }
  }
  else {
    local_230 = parent_node_00->wrapper_str;
    local_248 = (miniscript_node_t *)0x0;
    __n = 0;
    bVar4 = false;
    bVar3 = false;
    iVar6 = 0;
    lVar11 = 0;
    lVar14 = 0;
    local_278 = network;
    do {
      pmVar2 = parent_node_00->info;
      cVar1 = miniscript[__n];
      if ((pmVar2 == (miniscript_item_t *)0x0) && (cVar1 == ':')) {
        if (0xc < __n - lVar14) goto LAB_0049a619;
        memcpy(local_230,miniscript + lVar14,__n - lVar14);
        lVar14 = __n + 1;
      }
      else if (cVar1 == ',') {
        bVar4 = true;
        iVar5 = 1;
        if ((bool)(bVar3 & iVar6 == 1)) {
LAB_0049a40c:
          sVar16 = __n - lVar11;
          iVar6 = realloc_substr_buffer(sVar16,&sub_str,&sub_str_len);
          pcVar9 = sub_str;
          if (iVar6 != 0) goto LAB_0049ada5;
          local_254 = iVar5;
          memcpy(sub_str,miniscript + lVar11,sVar16);
          pcVar9[sVar16] = '\0';
          astarisk_index = local_278;
          iVar6 = analyze_miniscript(pcVar9,local_240,local_250,local_270,target,local_278,flags,
                                     local_248,parent_node_00,&child,(char **)0x0);
          if (iVar6 != 0) goto LAB_0049ada5;
          local_248 = child;
          child = (miniscript_node_t *)0x0;
          if (miniscript[__n] == ',') {
            lVar11 = __n + 1;
            lVar14 = __n + 1;
          }
          bVar4 = true;
          iVar6 = local_254;
        }
      }
      else if (cVar1 == ')') {
        bVar4 = true;
        if (iVar6 == 0) {
          iVar6 = 0;
        }
        else {
          iVar6 = iVar6 + -1;
          if ((bVar3) && (iVar6 == 0)) {
            lVar14 = __n + 1;
            bVar3 = false;
            iVar5 = 0;
            goto LAB_0049a40c;
          }
        }
      }
      else if (cVar1 == '(') {
        if (iVar6 == 0 && pmVar2 == (miniscript_item_t *)0x0) {
          memcpy(buffer,miniscript + lVar14,__n - lVar14);
          sVar13 = strlen(buffer);
          lVar14 = 0;
          while ((uVar12 = *(uint *)((long)&miniscript_info_table[0].kind + lVar14),
                 (uVar12 & target) == 0 ||
                 (iVar5 = bcmp(buffer,*(void **)((long)&miniscript_info_table[0].name + lVar14),
                               sVar13 + 1), iVar5 != 0))) {
            lVar14 = lVar14 + 0x28;
            if (lVar14 == 0x438) {
              parent_node_00->info = (miniscript_item_t *)0x0;
              goto LAB_0049a619;
            }
          }
          parent_node_00->info =
               (miniscript_item_t *)((long)&miniscript_info_table[0].name + lVar14);
          if ((parent_node_00->wrapper_str[0] != '\0') && ((uVar12 & 1) == 0)) goto LAB_0049a619;
          lVar14 = __n + 1;
          bVar3 = true;
          lVar11 = lVar14;
        }
        iVar6 = iVar6 + 1;
        bVar4 = true;
      }
      else if (((parent_node == (miniscript_node_t *)0x0) && (cVar1 == '#')) &&
              ((iVar6 == 0 && !bVar3) && pmVar2 != (miniscript_item_t *)0x0)) {
        sVar7 = strlen(miniscript + __n + 1);
        iVar6 = -2;
        if (0xb < sVar7) goto LAB_0049ada5;
        memcpy(checksum,miniscript + __n + 1,sVar7);
        if (bVar4) goto LAB_0049abcb;
        bVar3 = true;
        network = local_278;
        goto LAB_0049a5de;
      }
      __n = __n + 1;
    } while (__n != sVar7);
    network = local_278;
    if (!bVar4) goto LAB_0049a5a0;
    __n = 0;
LAB_0049abcb:
    pmVar2 = parent_node_00->info;
    iVar6 = 0;
    if (pmVar2 != (miniscript_item_t *)0x0) {
      if (((pmVar2->kind & 1) != 0) && (parent_node_00->wrapper_str[0] != '\0')) {
        uVar12 = 0;
        lVar14 = 8;
        do {
          pcVar9 = strchr(parent_node_00->wrapper_str,
                          (int)**(char **)((long)&g_network_address_table[4].segwit_prefix + lVar14)
                         );
          if (pcVar9 != (char *)0x0) {
            uVar12 = uVar12 | *(uint *)((long)&miniscript_wrapper_table[0].name + lVar14);
          }
          lVar14 = lVar14 + 0x28;
        } while (lVar14 != 0x198);
        parent_node_00->wrapper = uVar12;
      }
      if (pmVar2->verify_function != (wally_verify_descriptor_t)0x0) {
        iVar6 = (*pmVar2->verify_function)(parent_node_00,parent_node);
      }
    }
    if (((__n == 0) || (parent_node != (miniscript_node_t *)0x0)) || (iVar6 != 0)) {
LAB_0049acea:
      if (((parent_node == (miniscript_node_t *)0x0) && (script_ignore_checksum != (char **)0x0)) &&
         (iVar6 == 0)) {
        if (__n == 0) {
          pcVar9 = wally_strdup(miniscript);
          *script_ignore_checksum = pcVar9;
        }
        else {
          pcVar9 = *script_ignore_checksum;
        }
        if (pcVar9 == (char *)0x0) {
LAB_0049ad9f:
          iVar6 = -3;
        }
        else {
LAB_0049ad20:
          if (parent_node_00->wrapper == 0) {
LAB_0049ade2:
            *generate_node = parent_node_00;
            if ((parent_node != (miniscript_node_t *)0x0) &&
               (parent_node->child == (miniscript_node_t *)0x0)) {
              parent_node->child = parent_node_00;
            }
            if (prev_node == (miniscript_node_t *)0x0) {
              parent_node_00->chain_count = 1;
            }
            else {
              parent_node_00->chain_count = prev_node->chain_count + 1;
              parent_node_00->back = prev_node;
              prev_node->next = parent_node_00;
            }
            iVar6 = 0;
            goto LAB_0049adae;
          }
          sVar7 = strlen(parent_node_00->wrapper_str);
          while (sVar7 != 0) {
            lVar14 = sVar7 - 1;
            sVar7 = sVar7 - 1;
            lVar11 = 0x18;
            while (**(char **)((long)&g_network_address_table[3].segwit_prefix + lVar11) !=
                   parent_node_00->wrapper_str[lVar14]) {
              lVar11 = lVar11 + 0x28;
              iVar6 = -2;
              if (lVar11 == 0x1a8) goto LAB_0049ada5;
            }
            iVar6 = (**(code **)((long)&miniscript_wrapper_table[0].name + lVar11))
                              (parent_node_00,0);
            if (iVar6 != 0) goto LAB_0049ada5;
          }
          iVar6 = check_type_properties(parent_node_00->type_properties);
          if (iVar6 == 0) goto LAB_0049ade2;
        }
      }
      else if (iVar6 == 0) goto LAB_0049ad20;
    }
    else {
      iVar6 = realloc_substr_buffer(__n + 1,&sub_str,&sub_str_len);
      pcVar9 = sub_str;
      if (iVar6 == 0) {
        memcpy(sub_str,miniscript,__n);
        pcVar9[__n] = '\0';
        if (script_ignore_checksum != (char **)0x0) {
          pcVar10 = wally_strdup(pcVar9);
          *script_ignore_checksum = pcVar10;
        }
        iVar6 = generate_descriptor_checksum(pcVar9,work_checksum);
        if (iVar6 == 0) {
          iVar6 = (uint)(checksum._0_8_ == work_checksum._0_8_) * 2 + -2;
          goto LAB_0049acea;
        }
      }
    }
  }
LAB_0049ada5:
  free_miniscript_node(parent_node_00);
LAB_0049adae:
  pcVar9 = sub_str;
  if (sub_str != (char *)0x0) {
    wally_bzero(sub_str,sub_str_len);
  }
  wally_free(pcVar9);
  return iVar6;
}

Assistant:

static int analyze_miniscript(
    const char *miniscript,
    const char **key_name_array,
    const char **key_value_array,
    size_t array_len,
    uint32_t target,
    uint32_t *network,
    uint32_t flags,
    struct miniscript_node_t *prev_node,
    struct miniscript_node_t *parent_node,
    struct miniscript_node_t **generate_node,
    char **script_ignore_checksum)
{
    int ret = WALLY_OK;
    char *sub_str = NULL;
    size_t index;
    size_t str_len;
    size_t sub_str_len = 0;
    size_t offset = 0;
    size_t child_offset = 0;
    uint32_t indent = 0;
    bool collect_child = false;
    bool exist_indent = false;
    bool copy_child = false;
    char buffer[64];
    char checksum[12];
    char work_checksum[12];
    size_t checksum_len = 0;
    size_t checksum_index = 0;
    struct miniscript_node_t *node;
    struct miniscript_node_t *child = NULL;
    struct miniscript_node_t *prev_child = NULL;

    str_len = strlen(miniscript);

    node = (struct miniscript_node_t *) wally_malloc(sizeof(struct miniscript_node_t));
    if (!node)
        return WALLY_ENOMEM;

    wally_bzero(node, sizeof(struct miniscript_node_t));
    wally_bzero(buffer, sizeof(buffer));
    wally_bzero(checksum, sizeof(checksum));
    wally_bzero(work_checksum, sizeof(work_checksum));
    if (parent_node)
        node->parent = parent_node;

    for (index = 0; index < str_len; ++index) {
        if (!node->info && (miniscript[index] == ':')) {
            if (index - offset > sizeof(node->wrapper_str)) {
                ret = WALLY_EINVAL;
                break;
            }
            memcpy(node->wrapper_str, &miniscript[offset], index - offset);
            offset = index + 1;
        } else if (miniscript[index] == '(') {
            if (!node->info && (indent == 0)) {
                collect_child = true;
                memcpy(buffer, &miniscript[offset], index - offset);
                node->info = search_miniscript_info(buffer, target);
                if (!node->info) {
                    ret = WALLY_EINVAL;
                    break;
                } else if ((node->wrapper_str[0] != '\0') &&
                           ((node->info->kind & DESCRIPTOR_KIND_MINISCRIPT) == 0)) {
                    ret = WALLY_EINVAL;
                    break;
                }
                offset = index + 1;
                child_offset = offset;
            }
            ++indent;
            exist_indent = true;
        } else if (miniscript[index] == ')') {
            if (indent) {
                --indent;
                if (collect_child && (indent == 0)) {
                    collect_child = false;
                    offset = index + 1;
                    copy_child = true;
                }
            }
            exist_indent = true;
        } else if (miniscript[index] == ',') {
            if (collect_child && (indent == 1)) {
                copy_child = true;
            }
            exist_indent = true;
        } else if (miniscript[index] == '#') {
            if (!parent_node && node->info && !collect_child && (indent == 0)) {
                checksum_index = index;
                checksum_len = strlen(&miniscript[index + 1]);
                if (sizeof(checksum) > checksum_len) {
                    memcpy(checksum, &miniscript[index + 1], checksum_len);
                } else {
                    ret = WALLY_EINVAL;
                }
                break;  /* end */
            }
        }

        if (copy_child) {
            ret = realloc_substr_buffer(index - child_offset, &sub_str, &sub_str_len);
            if (ret != WALLY_OK)
                break;

            memcpy(sub_str, &miniscript[child_offset], index - child_offset);
            sub_str[index - child_offset] = '\0';
            ret = analyze_miniscript(sub_str,
                                     key_name_array,
                                     key_value_array,
                                     array_len,
                                     target,
                                     network,
                                     flags,
                                     prev_child,
                                     node,
                                     &child,
                                     NULL);
            if (ret != WALLY_OK)
                break;

            prev_child = child;
            child = NULL;
            copy_child = false;
            if (miniscript[index] == ',') {
                offset = index + 1;
                child_offset = offset;
            }
        }
    }

    if ((ret == WALLY_OK) && !exist_indent)
        ret = analyze_miniscript_value(miniscript,
                                       key_name_array,
                                       key_value_array,
                                       array_len,
                                       network,
                                       flags,
                                       node,
                                       parent_node);

    if ((ret == WALLY_OK) && node->info && (node->info->kind & DESCRIPTOR_KIND_MINISCRIPT) &&
        (node->wrapper_str[0] != '\0')) {
        node->wrapper = convert_miniscript_wrapper_flag(node->wrapper_str);
    }

    if ((ret == WALLY_OK) && node->info && node->info->verify_function)
        ret = node->info->verify_function(node, parent_node);

    if ((ret == WALLY_OK) && !parent_node && checksum_index) {
        /* check checksum */
        ret = realloc_substr_buffer(checksum_index + 1, &sub_str, &sub_str_len);
        if (ret == WALLY_OK) {
            memcpy(sub_str, miniscript, checksum_index);
            sub_str[checksum_index] = '\0';
            if (script_ignore_checksum)
                *script_ignore_checksum = wally_strdup(sub_str);

            ret = generate_descriptor_checksum(sub_str, work_checksum);
            if ((ret == WALLY_OK) && (memcmp(checksum, work_checksum, DESCRIPTOR_CHECKSUM_LENGTH) != 0)) {
                ret = WALLY_EINVAL;
            }
        }
    }
    if ((ret == WALLY_OK) && !parent_node && script_ignore_checksum) {
        if (!checksum_index)
            *script_ignore_checksum = wally_strdup(miniscript);

        if (*script_ignore_checksum == NULL)
            ret = WALLY_ENOMEM;
    }

    if ((ret == WALLY_OK) && node->wrapper) {
        const struct miniscript_wrapper_item_t *item = NULL;
        size_t len;
        size_t table_idx;
        size_t max;
        /* back from wrapper string */
        max = sizeof(miniscript_wrapper_table) / sizeof(struct miniscript_item_t);
        len = strlen(node->wrapper_str);
        for (index = len; index > 0; --index) {
            item = NULL;
            for (table_idx = 0; table_idx < max; ++table_idx) {
                if (miniscript_wrapper_table[table_idx].name[0] == node->wrapper_str[index - 1]) {
                    item = &miniscript_wrapper_table[table_idx];
                    break;
                }
            }
            if (!item) {
                ret = WALLY_EINVAL;
                break;
            }

            ret = item->verify_function(node, NULL);
            if (ret != WALLY_OK)
                break;
        }
        if (ret == WALLY_OK)
            ret = check_type_properties(node->type_properties);
    }

    if (ret == WALLY_OK) {
        *generate_node = node;
        if (parent_node && !parent_node->child)
            parent_node->child = node;
        if (prev_node) {
            node->chain_count = prev_node->chain_count + 1;
            node->back = prev_node;
            prev_node->next = node;
        } else {
            node->chain_count = 1;
        }
    } else {
        free_miniscript_node(node);
    }

    if (sub_str)
        wally_bzero(sub_str, sub_str_len);
    wally_free(sub_str);
    return ret;
}